

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

bool __thiscall
Satyricon::SATSolver::new_clause
          (SATSolver *this,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *c,
          bool learnt,ClausePtr *c_ref)

{
  pointer *ppWVar1;
  vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *pvVar2;
  uint uVar3;
  literal_value lVar4;
  pointer pLVar5;
  pointer plVar6;
  pointer pLVar7;
  pointer piVar8;
  iterator iVar9;
  bool bVar10;
  bool bVar11;
  Clause *pCVar12;
  long lVar13;
  ulong uVar14;
  undefined7 in_register_00000011;
  Clause *pCVar15;
  ulong uVar16;
  size_type __new_size;
  Clause *pCVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  literal_value lVar21;
  bool bVar22;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 local_48;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *local_40;
  SATSolver *local_38;
  
  *c_ref = (ClausePtr)0x0;
  if ((int)CONCAT71(in_register_00000011,learnt) == 0) {
    pLVar5 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar5;
    bVar22 = lVar13 != 0;
    if (lVar13 == 0) {
      __new_size = 0;
    }
    else {
      uVar14 = lVar13 >> 2;
      plVar6 = (this->values).
               super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = 1;
      __new_size = 0;
      uVar19 = 0;
      do {
        uVar3 = pLVar5[uVar19].value;
        lVar4 = plVar6[uVar3 >> 1];
        lVar21 = LIT_TRUE - lVar4;
        if ((uVar3 & 1) == 0) {
          lVar21 = lVar4;
        }
        if (lVar21 != LIT_FALSE) {
          lVar4 = plVar6[uVar3 >> 1];
          lVar21 = LIT_TRUE - lVar4;
          if ((uVar3 & 1) == 0) {
            lVar21 = lVar4;
          }
          uVar16 = uVar18;
          if (lVar21 == LIT_TRUE) break;
          do {
            iVar20 = 5;
            if (uVar14 <= uVar16) {
              bVar11 = false;
              bVar10 = false;
              goto LAB_00113882;
            }
            pLVar7 = pLVar5 + uVar16;
            if (pLVar7->value == uVar3) {
              bVar10 = true;
              bVar11 = false;
              goto LAB_00113882;
            }
            uVar16 = uVar16 + 1;
          } while ((pLVar7->value ^ uVar3) != 1);
          bVar10 = false;
          iVar20 = 1;
          bVar11 = true;
LAB_00113882:
          if (!bVar11) {
            iVar20 = 0;
          }
          if (!bVar10 && !bVar11) {
            pLVar5[__new_size].value = uVar3;
            __new_size = __new_size + 1;
            iVar20 = 0;
          }
          if (iVar20 != 0) break;
        }
        uVar19 = uVar19 + 1;
        bVar22 = uVar19 < uVar14;
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar14 + (uVar14 == 0));
    }
    if (bVar22) {
      return false;
    }
    local_40 = (anon_union_8_2_f7e3ed0a_for_Watcher_0 *)c_ref;
    local_38 = this;
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::resize(c,__new_size);
    this = local_38;
    c_ref = (ClausePtr *)local_40;
  }
  pLVar5 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar7 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar5 == pLVar7) {
    return true;
  }
  if ((long)pLVar7 - (long)pLVar5 != 4) {
    local_48.clause = Clause::allocate(c,learnt);
    *c_ref = (ClausePtr)local_48;
    if (learnt) {
      pCVar15 = (Clause *)(local_48.bits + 0xc);
      if ((ulong)(*(uint *)local_48.clause & 0xfffffffe) != 4) {
        pCVar17 = (Clause *)(local_48.bits + 0x10);
        piVar8 = (this->decision_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (ulong)(*(uint *)local_48.clause & 0xfffffffe) * 2 + -8;
        do {
          pCVar12 = pCVar17;
          if (piVar8[*(uint *)pCVar17 >> 1] <= piVar8[*(uint *)pCVar15 >> 1]) {
            pCVar12 = pCVar15;
          }
          pCVar15 = pCVar12;
          pCVar17 = (Clause *)&pCVar17->field_0x4;
          lVar13 = lVar13 + -4;
        } while (lVar13 != 0);
      }
      uVar3 = *(uint *)pCVar15;
      *(uint *)pCVar15 = *(uint *)(local_48.bits + 0xc);
      *(uint *)(local_48.bits + 0xc) = uVar3;
      if ((*(uint *)local_48.clause & 1) == 0) {
        __assert_fail("is_learned()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                      ,0x7f,"double &Satyricon::Clause::get_activity()");
      }
      uVar14 = (ulong)(*(uint *)local_48.clause >> 1);
      *(double *)(&((Clause *)(local_48.bits + 8))->field_0x0 + uVar14 * 4) =
           (this->param).clause_activity_update +
           *(double *)(&((Clause *)(local_48.bits + 8))->field_0x0 + uVar14 * 4);
    }
    pvVar2 = (this->watch_list).
             super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_48.bits + 8);
    iVar9._M_current =
         (pvVar2->
         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (pvVar2->
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      _M_realloc_insert<Satyricon::SATSolver::Watcher>(pvVar2,iVar9,(Watcher *)&local_48);
    }
    else {
      ((iVar9._M_current)->field_0).clause = (ClausePtr)local_48;
      ppWVar1 = &(pvVar2->
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
    local_48.clause = *c_ref;
    pvVar2 = (this->watch_list).
             super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_48.bits + 0xc);
    iVar9._M_current =
         (pvVar2->
         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (pvVar2->
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      _M_realloc_insert<Satyricon::SATSolver::Watcher>(pvVar2,iVar9,(Watcher *)&local_48);
    }
    else {
      ((iVar9._M_current)->field_0).clause = (ClausePtr)local_48;
      ppWVar1 = &(pvVar2->
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
    return false;
  }
  bVar22 = assign(this,(Literal)pLVar5->value,(ClausePtr)0x0);
  return bVar22;
}

Assistant:

bool SATSolver::new_clause(vector<Literal> &c, bool learnt, ClausePtr &c_ref) {

    c_ref = nullptr;

    if ( ! learnt ) { // simplify if possible, learned clause doesn't need this
        size_t j = 0;
        for ( size_t i = 0; i < c.size(); i++ ) {
            // discard false literal
            if ( get_asigned_value( c[i] ) == LIT_FALSE ) continue;
            // already satisfied?
            if ( get_asigned_value( c[i] ) == LIT_TRUE  )
                return false; // no conflict, new clause is a nullptr
            // look for tautology or repetition
            bool add = true;
            for ( size_t k = i+1; k < c.size(); ++k ) {
                if ( c[k] == c[i] ) { // repetition?
                    add = false;      // don't add the repeated literal
                    break;
                }
                if ( c[k] == !(c[i]) ) // tautology?
                    return false; // no conflict, new clause is a nullptr 
            }
            if ( add ) c[j++] = c[i];
        }
        c.resize(j);
    }

    // an empty clause is a conflict
    if (c.empty()) return true; // conflict, cnew clause is a nullptr

    // a clause with 1 literal is a unit, simply assign it
    if ( c.size() == 1 ) {
        // true if the assignment is in conflict, false otherwise
        // the new clause is a nullptr (don't build clause of one literal)
        return  assign( c[0], nullptr );
    }

    // build the clause
    c_ref = Clause::allocate(c,learnt);

    if ( learnt ) { 
        // pick a correct second literal to watch
        auto second = c_ref->begin()+1;
        for ( auto it = c_ref->begin()+2; it != c_ref->end(); ++it)
            if ( decision_levels[it->var()] > decision_levels[second->var()] )
                second = it;
        // swap
        Literal tmp = *second;
        *second = c_ref->at(1);
        c_ref->at(1) = tmp;

        // increase activity
        c_ref->update_activity( param.clause_activity_update );
    }

    //  add to the watch list
    watch_list[c_ref->at(0).index()].push_back(Watcher(c_ref));
    watch_list[c_ref->at(1).index()].push_back(Watcher(c_ref));

    return false; // no conflict
}